

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
               (pair<double,_int> *begin,
               __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
               end,int param_3,byte param_4)

{
  long lVar1;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var2;
  pair<double,_int> *ppVar3;
  int iVar4;
  pair<double,_int> *ppVar5;
  ulong uVar6;
  ulong uVar7;
  pair<double,_int> *ppVar8;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  _Var9;
  int iVar10;
  pair<double,_int> *ppVar11;
  long lVar12;
  pair<double,_int> *ppVar13;
  long lVar14;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  __first;
  ulong uVar15;
  bool bVar16;
  double __tmp;
  double dVar17;
  double dVar18;
  double __tmp_2;
  double dVar19;
  double __tmp_9;
  double dVar20;
  pair<__gnu_cxx::__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>,_bool>
  pVar21;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> __cmp;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> __cmp_1;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> local_3e;
  _Iter_comp_iter<std::less<std::pair<double,_int>_>_> local_3d;
  int local_3c;
  pair<double,_int> *local_38;
  
  uVar7 = (long)end._M_current - (long)begin >> 4;
  if ((long)uVar7 < 0x18) {
    bVar16 = param_4 == 0;
  }
  else {
    local_38 = end._M_current + -1;
    __first._M_current = begin;
    local_3c = param_3;
    do {
      uVar6 = uVar7 >> 1;
      ppVar3 = __first._M_current + uVar6;
      if (uVar7 < 0x81) {
        dVar17 = (__first._M_current)->first;
        dVar18 = ppVar3->first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = (__first._M_current)->second;
            iVar10 = ppVar3->second;
            if (iVar4 < iVar10) goto LAB_00354020;
          }
        }
        else {
          iVar10 = ppVar3->second;
          iVar4 = (__first._M_current)->second;
LAB_00354020:
          ppVar3->first = dVar17;
          (__first._M_current)->first = dVar18;
          ppVar3->second = iVar4;
          (__first._M_current)->second = iVar10;
          dVar17 = dVar18;
        }
        dVar18 = local_38->first;
        if (dVar17 <= dVar18) {
          if (dVar18 <= dVar17) {
            iVar4 = end._M_current[-1].second;
            iVar10 = (__first._M_current)->second;
            if (iVar4 < iVar10) goto LAB_00354097;
          }
        }
        else {
          iVar10 = (__first._M_current)->second;
          iVar4 = end._M_current[-1].second;
LAB_00354097:
          (__first._M_current)->first = dVar18;
          end._M_current[-1].first = dVar17;
          (__first._M_current)->second = iVar4;
          end._M_current[-1].second = iVar10;
          dVar17 = (__first._M_current)->first;
        }
        dVar18 = ppVar3->first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = (__first._M_current)->second;
            iVar10 = ppVar3->second;
            if (iVar4 < iVar10) goto LAB_0035410e;
          }
        }
        else {
          iVar10 = ppVar3->second;
          iVar4 = (__first._M_current)->second;
LAB_0035410e:
          ppVar3->first = dVar17;
          (__first._M_current)->first = dVar18;
          ppVar3->second = iVar4;
          (__first._M_current)->second = iVar10;
        }
      }
      else {
        dVar17 = ppVar3->first;
        dVar18 = (__first._M_current)->first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = ppVar3->second;
            iVar10 = (__first._M_current)->second;
            if (iVar4 < iVar10) goto LAB_00353ff4;
          }
        }
        else {
          iVar10 = (__first._M_current)->second;
          iVar4 = ppVar3->second;
LAB_00353ff4:
          (__first._M_current)->first = dVar17;
          ppVar3->first = dVar18;
          (__first._M_current)->second = iVar4;
          ppVar3->second = iVar10;
          dVar17 = dVar18;
        }
        dVar18 = local_38->first;
        if (dVar17 <= dVar18) {
          if (dVar18 <= dVar17) {
            iVar4 = end._M_current[-1].second;
            iVar10 = ppVar3->second;
            if (iVar4 < iVar10) goto LAB_0035405a;
          }
        }
        else {
          iVar10 = ppVar3->second;
          iVar4 = end._M_current[-1].second;
LAB_0035405a:
          ppVar3->first = dVar18;
          end._M_current[-1].first = dVar17;
          ppVar3->second = iVar4;
          end._M_current[-1].second = iVar10;
          dVar17 = ppVar3->first;
        }
        dVar18 = (__first._M_current)->first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = ppVar3->second;
            iVar10 = (__first._M_current)->second;
            if (iVar4 < iVar10) goto LAB_003540d6;
          }
        }
        else {
          iVar10 = (__first._M_current)->second;
          iVar4 = ppVar3->second;
LAB_003540d6:
          (__first._M_current)->first = dVar17;
          ppVar3->first = dVar18;
          (__first._M_current)->second = iVar4;
          ppVar3->second = iVar10;
        }
        ppVar5 = __first._M_current + (uVar6 - 1);
        dVar17 = ppVar5->first;
        dVar18 = __first._M_current[1].first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = __first._M_current[uVar6 - 1].second;
            iVar10 = __first._M_current[1].second;
            if (iVar4 < iVar10) goto LAB_00354158;
          }
        }
        else {
          iVar10 = __first._M_current[1].second;
          iVar4 = __first._M_current[uVar6 - 1].second;
LAB_00354158:
          __first._M_current[1].first = dVar17;
          ppVar5->first = dVar18;
          __first._M_current[1].second = iVar4;
          __first._M_current[uVar6 - 1].second = iVar10;
          dVar17 = dVar18;
        }
        dVar18 = end._M_current[-2].first;
        if (dVar17 <= dVar18) {
          if (dVar18 <= dVar17) {
            iVar4 = end._M_current[-2].second;
            iVar10 = __first._M_current[uVar6 - 1].second;
            if (iVar4 < iVar10) goto LAB_003541af;
          }
        }
        else {
          iVar10 = __first._M_current[uVar6 - 1].second;
          iVar4 = end._M_current[-2].second;
LAB_003541af:
          ppVar5->first = dVar18;
          end._M_current[-2].first = dVar17;
          __first._M_current[uVar6 - 1].second = iVar4;
          end._M_current[-2].second = iVar10;
          dVar17 = ppVar5->first;
        }
        dVar18 = __first._M_current[1].first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = __first._M_current[uVar6 - 1].second;
            iVar10 = __first._M_current[1].second;
            if (iVar4 < iVar10) goto LAB_003541e9;
          }
        }
        else {
          iVar10 = __first._M_current[1].second;
          iVar4 = __first._M_current[uVar6 - 1].second;
LAB_003541e9:
          __first._M_current[1].first = dVar17;
          ppVar5->first = dVar18;
          __first._M_current[1].second = iVar4;
          __first._M_current[uVar6 - 1].second = iVar10;
        }
        ppVar13 = __first._M_current + uVar6 + 1;
        dVar17 = ppVar13->first;
        dVar18 = __first._M_current[2].first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = __first._M_current[uVar6 + 1].second;
            iVar10 = __first._M_current[2].second;
            if (iVar4 < iVar10) goto LAB_00354230;
          }
        }
        else {
          iVar10 = __first._M_current[2].second;
          iVar4 = __first._M_current[uVar6 + 1].second;
LAB_00354230:
          __first._M_current[2].first = dVar17;
          ppVar13->first = dVar18;
          __first._M_current[2].second = iVar4;
          __first._M_current[uVar6 + 1].second = iVar10;
          dVar17 = dVar18;
        }
        dVar18 = end._M_current[-3].first;
        if (dVar17 <= dVar18) {
          if (dVar18 <= dVar17) {
            iVar4 = end._M_current[-3].second;
            iVar10 = __first._M_current[uVar6 + 1].second;
            if (iVar4 < iVar10) goto LAB_0035426c;
          }
        }
        else {
          iVar10 = __first._M_current[uVar6 + 1].second;
          iVar4 = end._M_current[-3].second;
LAB_0035426c:
          ppVar13->first = dVar18;
          end._M_current[-3].first = dVar17;
          __first._M_current[uVar6 + 1].second = iVar4;
          end._M_current[-3].second = iVar10;
          dVar17 = ppVar13->first;
        }
        dVar18 = __first._M_current[2].first;
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = __first._M_current[uVar6 + 1].second;
            iVar10 = __first._M_current[2].second;
            if (iVar4 < iVar10) goto LAB_003542a6;
          }
        }
        else {
          iVar10 = __first._M_current[2].second;
          iVar4 = __first._M_current[uVar6 + 1].second;
LAB_003542a6:
          __first._M_current[2].first = dVar17;
          ppVar13->first = dVar18;
          __first._M_current[2].second = iVar4;
          __first._M_current[uVar6 + 1].second = iVar10;
          dVar17 = dVar18;
        }
        dVar18 = ppVar3->first;
        dVar20 = ppVar5->first;
        if (dVar20 <= dVar18) {
          dVar19 = dVar20;
          if (dVar18 <= dVar20) {
            iVar4 = ppVar3->second;
            iVar10 = __first._M_current[uVar6 - 1].second;
            if (iVar4 < iVar10) goto LAB_003542e5;
          }
        }
        else {
          iVar10 = __first._M_current[uVar6 - 1].second;
          iVar4 = ppVar3->second;
LAB_003542e5:
          ppVar5->first = dVar18;
          ppVar3->first = dVar20;
          __first._M_current[uVar6 - 1].second = iVar4;
          ppVar3->second = iVar10;
          dVar19 = dVar18;
          dVar18 = dVar20;
        }
        if (dVar18 <= dVar17) {
          if (dVar17 <= dVar18) {
            iVar4 = __first._M_current[uVar6 + 1].second;
            iVar10 = ppVar3->second;
            if (iVar4 < iVar10) goto LAB_0035431d;
          }
        }
        else {
          iVar10 = ppVar3->second;
          iVar4 = __first._M_current[uVar6 + 1].second;
LAB_0035431d:
          ppVar3->first = dVar17;
          ppVar13->first = dVar18;
          ppVar3->second = iVar4;
          __first._M_current[uVar6 + 1].second = iVar10;
          dVar18 = dVar17;
        }
        if (dVar19 <= dVar18) {
          if (dVar18 <= dVar19) {
            iVar4 = ppVar3->second;
            iVar10 = __first._M_current[uVar6 - 1].second;
            if (iVar4 < iVar10) goto LAB_0035434d;
          }
          else {
            iVar4 = ppVar3->second;
          }
        }
        else {
          iVar10 = __first._M_current[uVar6 - 1].second;
          iVar4 = ppVar3->second;
LAB_0035434d:
          ppVar5->first = dVar18;
          ppVar3->first = dVar19;
          __first._M_current[uVar6 - 1].second = iVar4;
          ppVar3->second = iVar10;
          dVar18 = dVar19;
          iVar4 = iVar10;
        }
        dVar17 = (__first._M_current)->first;
        (__first._M_current)->first = dVar18;
        ppVar3->first = dVar17;
        iVar10 = (__first._M_current)->second;
        (__first._M_current)->second = iVar4;
        ppVar3->second = iVar10;
      }
      if ((param_4 & 1) == 0) {
        dVar18 = (__first._M_current)->first;
        if (__first._M_current[-1].first < dVar18) goto LAB_003543b2;
        if (__first._M_current[-1].first <= dVar18) {
          iVar10 = (__first._M_current)->second;
          if (__first._M_current[-1].second < iVar10) goto LAB_003543b2;
        }
        else {
          iVar10 = (__first._M_current)->second;
        }
        for (lVar1 = 0;
            (dVar17 = *(double *)((long)&local_38->first + lVar1), dVar18 < dVar17 ||
            ((dVar18 <= dVar17 && (iVar10 < *(int *)((long)&local_38->second + lVar1)))));
            lVar1 = lVar1 + -0x10) {
        }
        begin = (pair<double,_int> *)((long)&local_38->first + lVar1);
        if (lVar1 == 0) {
          _Var2._M_current = __first._M_current;
          dVar20 = dVar18;
          if (__first._M_current < begin) {
            dVar20 = __first._M_current[1].first;
            _Var9._M_current = __first._M_current;
            while (_Var2._M_current = _Var9._M_current + 1, dVar20 <= dVar18) {
              if (dVar18 <= dVar20) {
                if ((begin <= _Var2._M_current) || (iVar10 < _Var9._M_current[1].second)) break;
              }
              else if (begin <= _Var2._M_current) break;
              dVar20 = _Var9._M_current[2].first;
              _Var9._M_current = _Var2._M_current;
            }
          }
        }
        else {
          dVar20 = __first._M_current[1].first;
          _Var9._M_current = __first._M_current;
          while ((_Var2._M_current = _Var9._M_current + 1, dVar20 <= dVar18 &&
                 ((dVar20 < dVar18 || (_Var9._M_current[1].second <= iVar10))))) {
            dVar20 = _Var9._M_current[2].first;
            _Var9._M_current = _Var2._M_current;
          }
        }
LAB_0035495a:
        if (_Var2._M_current < begin) {
          (_Var2._M_current)->first = dVar17;
          begin->first = dVar20;
          iVar4 = (_Var2._M_current)->second;
          (_Var2._M_current)->second = begin->second;
          begin->second = iVar4;
          do {
            do {
              ppVar3 = begin;
              begin = ppVar3 + -1;
              dVar17 = begin->first;
            } while (dVar18 < dVar17);
          } while ((dVar18 <= dVar17) && (iVar10 < ppVar3[-1].second));
          do {
            ppVar3 = _Var2._M_current;
            dVar20 = ppVar3[1].first;
            _Var2._M_current = ppVar3 + 1;
            if (dVar18 < dVar20) break;
          } while ((dVar20 < dVar18) || (ppVar3[1].second <= iVar10));
          goto LAB_0035495a;
        }
        (__first._M_current)->first = dVar17;
        (__first._M_current)->second = begin->second;
        begin->first = dVar18;
        begin->second = iVar10;
        begin = begin + 1;
        uVar7 = (long)end._M_current - (long)begin >> 4;
      }
      else {
LAB_003543b2:
        pVar21 = partition_right<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>>
                           (__first._M_current,end._M_current);
        _Var2 = pVar21.first._M_current;
        uVar6 = (long)_Var2._M_current - (long)__first._M_current >> 4;
        begin = _Var2._M_current + 1;
        uVar15 = (long)end._M_current - (long)begin >> 4;
        if (((long)uVar6 < (long)(uVar7 >> 3)) || ((long)uVar15 < (long)(uVar7 >> 3))) {
          local_3c = local_3c + -1;
          if (local_3c == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<double,int>>>>
                      (__first,end,&local_3e);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<double,int>>>>
                      (__first,end,&local_3d);
            return;
          }
          if (0x17 < (long)uVar6) {
            uVar7 = uVar6 >> 2;
            dVar18 = (__first._M_current)->first;
            (__first._M_current)->first = __first._M_current[uVar7].first;
            __first._M_current[uVar7].first = dVar18;
            iVar10 = (__first._M_current)->second;
            (__first._M_current)->second = __first._M_current[uVar7].second;
            __first._M_current[uVar7].second = iVar10;
            ppVar3 = _Var2._M_current + -uVar7;
            dVar18 = _Var2._M_current[-1].first;
            _Var2._M_current[-1].first = ppVar3->first;
            ppVar3->first = dVar18;
            iVar10 = _Var2._M_current[-1].second;
            _Var2._M_current[-1].second = ppVar3->second;
            ppVar3->second = iVar10;
            if (0x80 < uVar6) {
              dVar18 = __first._M_current[1].first;
              __first._M_current[1].first = __first._M_current[uVar7 + 1].first;
              __first._M_current[uVar7 + 1].first = dVar18;
              iVar10 = __first._M_current[1].second;
              __first._M_current[1].second = __first._M_current[uVar7 + 1].second;
              __first._M_current[uVar7 + 1].second = iVar10;
              dVar18 = __first._M_current[2].first;
              __first._M_current[2].first = __first._M_current[uVar7 + 2].first;
              __first._M_current[uVar7 + 2].first = dVar18;
              iVar10 = __first._M_current[2].second;
              __first._M_current[2].second = __first._M_current[uVar7 + 2].second;
              __first._M_current[uVar7 + 2].second = iVar10;
              lVar1 = -2 - uVar7;
              uVar7 = ~uVar7;
              dVar18 = _Var2._M_current[-2].first;
              _Var2._M_current[-2].first = _Var2._M_current[uVar7].first;
              _Var2._M_current[uVar7].first = dVar18;
              iVar10 = _Var2._M_current[-2].second;
              _Var2._M_current[-2].second = _Var2._M_current[uVar7].second;
              _Var2._M_current[uVar7].second = iVar10;
              dVar18 = _Var2._M_current[-3].first;
              _Var2._M_current[-3].first = _Var2._M_current[lVar1].first;
              _Var2._M_current[lVar1].first = dVar18;
              iVar10 = _Var2._M_current[-3].second;
              _Var2._M_current[-3].second = _Var2._M_current[lVar1].second;
              _Var2._M_current[lVar1].second = iVar10;
            }
          }
          if (0x17 < (long)uVar15) {
            uVar7 = uVar15 >> 2;
            dVar18 = _Var2._M_current[1].first;
            _Var2._M_current[1].first = _Var2._M_current[uVar7 + 1].first;
            _Var2._M_current[uVar7 + 1].first = dVar18;
            iVar10 = _Var2._M_current[1].second;
            _Var2._M_current[1].second = _Var2._M_current[uVar7 + 1].second;
            _Var2._M_current[uVar7 + 1].second = iVar10;
            ppVar3 = end._M_current + -uVar7;
            dVar18 = end._M_current[-1].first;
            end._M_current[-1].first = ppVar3->first;
            ppVar3->first = dVar18;
            iVar10 = end._M_current[-1].second;
            end._M_current[-1].second = ppVar3->second;
            ppVar3->second = iVar10;
            if (0x80 < uVar15) {
              dVar18 = _Var2._M_current[2].first;
              _Var2._M_current[2].first = _Var2._M_current[uVar7 + 2].first;
              _Var2._M_current[uVar7 + 2].first = dVar18;
              iVar10 = _Var2._M_current[2].second;
              _Var2._M_current[2].second = _Var2._M_current[uVar7 + 2].second;
              _Var2._M_current[uVar7 + 2].second = iVar10;
              dVar18 = _Var2._M_current[3].first;
              _Var2._M_current[3].first = _Var2._M_current[uVar7 + 3].first;
              _Var2._M_current[uVar7 + 3].first = dVar18;
              iVar10 = _Var2._M_current[3].second;
              _Var2._M_current[3].second = _Var2._M_current[uVar7 + 3].second;
              _Var2._M_current[uVar7 + 3].second = iVar10;
              lVar1 = -2 - uVar7;
              uVar7 = ~uVar7;
              dVar18 = end._M_current[-2].first;
              end._M_current[-2].first = end._M_current[uVar7].first;
              end._M_current[uVar7].first = dVar18;
              iVar10 = end._M_current[-2].second;
              end._M_current[-2].second = end._M_current[uVar7].second;
              end._M_current[uVar7].second = iVar10;
              dVar18 = end._M_current[-3].first;
              end._M_current[-3].first = end._M_current[lVar1].first;
              end._M_current[lVar1].first = dVar18;
              iVar10 = end._M_current[-3].second;
              end._M_current[-3].second = end._M_current[lVar1].second;
              end._M_current[lVar1].second = iVar10;
            }
          }
        }
        else if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__first._M_current + 1 != _Var2._M_current && __first._M_current != _Var2._M_current)
          {
            lVar1 = 0;
            uVar7 = 0;
            _Var9._M_current = __first._M_current;
            ppVar3 = __first._M_current + 1;
            do {
              dVar18 = (_Var9._M_current)->first;
              dVar17 = _Var9._M_current[1].first;
              if (dVar18 <= dVar17) {
                if (dVar17 <= dVar18) {
                  iVar10 = (_Var9._M_current)->second;
                  iVar4 = _Var9._M_current[1].second;
                  if (iVar4 < iVar10) goto LAB_00354438;
                }
              }
              else {
                iVar10 = (_Var9._M_current)->second;
                iVar4 = _Var9._M_current[1].second;
LAB_00354438:
                ppVar5 = ppVar3 + -1;
                _Var9._M_current[1].first = dVar18;
                ppVar3->second = iVar10;
                _Var9._M_current = __first._M_current;
                ppVar13 = ppVar3;
                lVar12 = lVar1;
                if (ppVar5 != __first._M_current) {
                  do {
                    dVar18 = ppVar5[-1].first;
                    if (dVar18 <= dVar17) {
                      _Var9._M_current = ppVar5;
                      if (dVar18 < dVar17) {
                        ppVar13 = ppVar5 + 1;
                        break;
                      }
                      iVar10 = ppVar5[-1].second;
                      if (iVar10 <= iVar4) break;
                    }
                    else {
                      iVar10 = ppVar5[-1].second;
                    }
                    ppVar5->first = dVar18;
                    ppVar5->second = iVar10;
                    lVar12 = lVar12 + 0x10;
                    _Var9._M_current = __first._M_current;
                    ppVar13 = ppVar5;
                    ppVar5 = ppVar5 + -1;
                  } while (lVar12 != 0);
                }
                (_Var9._M_current)->first = dVar17;
                ppVar13[-1].second = iVar4;
                uVar7 = uVar7 + ((long)ppVar3 - (long)_Var9._M_current >> 4);
                if (8 < uVar7) goto LAB_0035482a;
              }
              ppVar5 = ppVar3 + 1;
              lVar1 = lVar1 + -0x10;
              _Var9._M_current = ppVar3;
              ppVar3 = ppVar5;
            } while (ppVar5 != _Var2._M_current);
          }
          if (begin == end._M_current) {
            return;
          }
          if (_Var2._M_current + 2 == end._M_current) {
            return;
          }
          lVar1 = 0x20;
          lVar12 = 0;
          uVar7 = 0;
          ppVar3 = begin;
          do {
            ppVar5 = (pair<double,_int> *)((long)&(_Var2._M_current)->first + lVar1);
            dVar18 = *(double *)((long)&(_Var2._M_current)->first + lVar1);
            dVar17 = ppVar3->first;
            if (dVar17 <= dVar18) {
              if (dVar18 <= dVar17) {
                iVar10 = ppVar3->second;
                iVar4 = ppVar3[1].second;
                if (iVar4 < iVar10) goto LAB_00354523;
              }
            }
            else {
              iVar10 = ppVar3->second;
              iVar4 = ppVar3[1].second;
LAB_00354523:
              ppVar5->first = dVar17;
              ppVar5->second = iVar10;
              ppVar3 = begin;
              ppVar13 = ppVar5;
              if (lVar1 != 0x20) {
                ppVar11 = (pair<double,_int> *)((long)&_Var2._M_current[-1].first + lVar1);
                lVar14 = lVar12;
                do {
                  ppVar8 = ppVar11;
                  dVar17 = ppVar8[-1].first;
                  if (dVar17 <= dVar18) {
                    ppVar3 = ppVar8;
                    if (dVar17 < dVar18) {
                      ppVar13 = ppVar8 + 1;
                      break;
                    }
                    iVar10 = ppVar8[-1].second;
                    if (iVar10 <= iVar4) break;
                  }
                  else {
                    iVar10 = ppVar8[-1].second;
                  }
                  ppVar8->first = dVar17;
                  ppVar8->second = iVar10;
                  lVar14 = lVar14 + 0x10;
                  ppVar11 = ppVar8 + -1;
                  ppVar3 = begin;
                  ppVar13 = ppVar8;
                } while (lVar14 != 0);
              }
              ppVar3->first = dVar18;
              ppVar13[-1].second = iVar4;
              uVar7 = uVar7 + ((long)ppVar5 - (long)ppVar3 >> 4);
              if (8 < uVar7) break;
            }
            ppVar13 = (pair<double,_int> *)((long)&_Var2._M_current[1].first + lVar1);
            lVar1 = lVar1 + 0x10;
            lVar12 = lVar12 + -0x10;
            ppVar3 = ppVar5;
            if (ppVar13 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_0035482a:
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
                  (__first._M_current,_Var2._M_current,local_3c);
        param_4 = 0;
        uVar7 = uVar15;
      }
      __first._M_current = begin;
    } while (0x17 < (long)uVar7);
    bVar16 = (param_4 & 1) == 0;
  }
  if (bVar16) {
    ppVar3 = begin + 1;
    if (begin + 1 != end._M_current && begin != end._M_current) {
      do {
        ppVar5 = ppVar3;
        dVar18 = begin->first;
        dVar17 = begin[1].first;
        if (dVar18 <= dVar17) {
          if ((dVar17 <= dVar18) && (iVar10 = begin[1].second, iVar10 < begin->second))
          goto LAB_003549cf;
        }
        else {
          iVar10 = begin[1].second;
LAB_003549cf:
          do {
            do {
              ppVar3 = begin;
              ppVar3[1].first = dVar18;
              ppVar3[1].second = ppVar3->second;
              dVar18 = ppVar3[-1].first;
              begin = ppVar3 + -1;
            } while (dVar17 < dVar18);
          } while ((dVar17 <= dVar18) && (iVar10 < ppVar3[-1].second));
          ppVar3->first = dVar17;
          ppVar3->second = iVar10;
        }
        ppVar3 = ppVar5 + 1;
        begin = ppVar5;
      } while (ppVar3 != end._M_current);
    }
  }
  else if (begin + 1 != end._M_current && begin != end._M_current) {
    lVar1 = 0;
    ppVar3 = begin;
    ppVar5 = begin + 1;
    do {
      dVar18 = ppVar3->first;
      dVar17 = ppVar3[1].first;
      if (dVar18 <= dVar17) {
        if (dVar17 <= dVar18) {
          iVar10 = ppVar3->second;
          iVar4 = ppVar3[1].second;
          if (iVar4 < iVar10) goto LAB_00353f28;
        }
      }
      else {
        iVar10 = ppVar3->second;
        iVar4 = ppVar3[1].second;
LAB_00353f28:
        ppVar13 = ppVar5 + -1;
        ppVar3[1].first = dVar18;
        ppVar5->second = iVar10;
        ppVar3 = begin;
        ppVar11 = ppVar5;
        lVar12 = lVar1;
        if (ppVar13 != begin) {
          do {
            dVar18 = ppVar13[-1].first;
            if (dVar18 <= dVar17) {
              ppVar3 = ppVar13;
              if (dVar18 < dVar17) {
                ppVar11 = ppVar13 + 1;
                break;
              }
              iVar10 = ppVar13[-1].second;
              if (iVar10 <= iVar4) break;
            }
            else {
              iVar10 = ppVar13[-1].second;
            }
            ppVar13->first = dVar18;
            ppVar13->second = iVar10;
            lVar12 = lVar12 + 0x10;
            ppVar3 = begin;
            ppVar11 = ppVar13;
            ppVar13 = ppVar13 + -1;
          } while (lVar12 != 0);
        }
        ppVar3->first = dVar17;
        ppVar11[-1].second = iVar4;
      }
      ppVar13 = ppVar5 + 1;
      lVar1 = lVar1 + -0x10;
      ppVar3 = ppVar5;
      ppVar5 = ppVar13;
    } while (ppVar13 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }